

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O0

size_t __thiscall
ezc3d::ParametersNS::GroupNS::Group::parameterIdx(Group *this,string *parameterName)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Parameter *this_00;
  string *psVar3;
  Group *in_RDI;
  size_t in_stack_00000088;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  string local_38 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    __lhs = local_18;
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             nbParameters((Group *)0x15d317);
    if (pbVar2 <= __lhs) {
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x10);
      std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      std::operator+(__lhs,(char *)pbVar2);
      name_abi_cxx11_(in_RDI);
      std::operator+(__lhs,pbVar2);
      std::invalid_argument::invalid_argument((invalid_argument *)pbVar2,local_38);
      __cxa_throw(pbVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    this_00 = parameter((Group *)i,in_stack_00000088);
    psVar3 = Parameter::name_abi_cxx11_(this_00);
    iVar1 = std::__cxx11::string::compare((string *)psVar3);
    if (iVar1 == 0) break;
    local_18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &local_18->field_0x1;
  }
  return (size_t)local_18;
}

Assistant:

size_t ezc3d::ParametersNS::GroupNS::Group::parameterIdx(
    const std::string &parameterName) const {
  for (size_t i = 0; i < nbParameters(); ++i)
    if (!parameter(i).name().compare(parameterName))
      return i;
  throw std::invalid_argument("Group::parameterIdx could not find " +
                              parameterName + " in the group " + name());
}